

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O2

Lit_t __thiscall Potassco::ProgramReader::matchLit(ProgramReader *this,char *err)

{
  Lit_t LVar1;
  BufferedStream *str;
  
  str = stream(this);
  LVar1 = Potassco::matchLit(str,this->varMax_,err);
  return LVar1;
}

Assistant:

Lit_t    matchLit(const char* err = "literal expected") { return Potassco::matchLit(*stream(), varMax_, err); }